

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslCheckBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  int iVar5;
  allocator<char> local_101;
  string *local_100;
  DataType local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string indentation;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
  std::__cxx11::string::_M_construct((ulong)&indentation,(char)indentationDepth);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_100 = __return_storage_ptr__;
  std::operator+(&local_90,&indentation,"allOk = allOk && compare_");
  pcVar3 = glu::getDataTypeName(type);
  std::operator+(&local_70,&local_90,pcVar3);
  std::operator+(&local_d0,&local_70,"(");
  std::operator+(&local_b0,&local_d0,name);
  std::operator+(&local_f0,&local_b0,", ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  uVar4 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    pcVar3 = glu::getDataTypeName(type);
    std::operator+(&local_b0,&local_d0,pcVar3);
    std::operator+(&local_f0,&local_b0,"(");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    uVar4 = extraout_RDX_00;
  }
  iVar5 = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  local_f4 = type;
  for (; psVar1 = local_100, iVar2 != iVar5; iVar5 = iVar5 + 1) {
    if (iVar5 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"v",&local_101);
    }
    else {
      de::floatToString_abi_cxx11_(&local_b0,(de *)0x1,(float)iVar5 * 0.8,(int)uVar4);
      std::operator+(&local_f0,", v+",&local_b0);
    }
    std::__cxx11::string::append((string *)local_100);
    std::__cxx11::string::~string((string *)&local_f0);
    uVar4 = extraout_RDX_01;
    if (iVar5 != 0) {
      std::__cxx11::string::~string((string *)&local_b0);
      uVar4 = extraout_RDX_02;
    }
  }
  if (local_f4 != TYPE_FLOAT) {
    std::__cxx11::string::append((char *)local_100);
  }
  std::operator+(&local_90,");\n",&indentation);
  std::operator+(&local_70,&local_90,"v += 0.4;\n");
  std::operator+(&local_d0,&local_70,&indentation);
  std::operator+(&local_f0,&local_d0,"if (allOk) firstFailedInputIndex++;\n");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&indentation);
  return psVar1;
}

Assistant:

string UserDefinedIOCase::glslCheckBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + "allOk = allOk && compare_" + glu::getDataTypeName(type) + "(" + name + ", ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ");\n" +
			  indentation + "v += 0.4;\n" +
			  indentation + "if (allOk) firstFailedInputIndex++;\n";

	return result;
}